

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O2

void Fxch_ManUpdate(Fxch_Man_t *p,int iDiv)

{
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  int *piVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Vec_Int_t *pVVar14;
  Vec_Int_t *pVVar15;
  long lVar16;
  Vec_Int_t *pVVar17;
  Vec_Int_t *pVVar18;
  Vec_Int_t *p_02;
  uint i;
  int *piVar19;
  int iVar20;
  int *piVar21;
  int *piVar22;
  int iVar23;
  int *piVar24;
  int iVar25;
  int *piVar26;
  int *local_68;
  
  uVar6 = Gia_ManRandom(0);
  Vec_IntPush(&p->vRands,uVar6 & 0x3ffffff);
  uVar6 = Gia_ManRandom(0);
  Vec_IntPush(&p->vRands,uVar6 & 0x3ffffff);
  iVar7 = Hash_IntObjData0(p->vHash,iDiv);
  iVar8 = Hash_IntObjData1(p->vHash,iDiv);
  if (((iVar7 < 0) || (iVar8 < 0)) || (iVar8 <= iVar7)) {
    __assert_fail("Lit0 >= 0 && Lit1 >= 0 && Lit0 < Lit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x276,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  iVar25 = (p->vDivs).nSize;
  if (iVar25 == (p->vDivs).nCap) {
    iVar11 = 0x10;
    if (0xf < iVar25) {
      iVar11 = iVar25 * 2;
    }
    Vec_WrdGrow(&p->vDivs,iVar11);
    iVar25 = (p->vDivs).nSize;
  }
  (p->vDivs).nSize = iVar25 + 1;
  (p->vDivs).pArray[iVar25] = CONCAT44(iVar8,iVar7);
  p_00 = &p->vLits;
  pVVar14 = Vec_WecEntry(p_00,iVar7);
  pVVar15 = Vec_WecEntry(p_00,iVar8);
  Fxch_CompressCubes(p,pVVar14);
  Fxch_CompressCubes(p,pVVar15);
  p_01 = &p->vCubesS;
  piVar19 = pVVar14->pArray;
  local_68 = pVVar15->pArray;
  piVar2 = piVar19 + pVVar14->nSize;
  iVar25 = pVVar15->nSize;
  (p->vCubesS).nSize = 0;
  piVar1 = local_68 + iVar25;
  piVar21 = piVar19;
  piVar24 = piVar19;
  piVar26 = local_68;
  piVar22 = local_68;
  while ((piVar24 < piVar2 && (piVar26 < piVar1))) {
    iVar25 = *piVar24;
    iVar11 = *piVar26;
    if (iVar25 == iVar11) {
      Vec_IntPush(p_01,iVar25);
      piVar24 = piVar24 + 1;
      piVar26 = piVar26 + 1;
      piVar21 = piVar19;
    }
    else if (iVar25 < iVar11) {
      *piVar19 = iVar25;
      piVar19 = piVar19 + 1;
      piVar21 = piVar21 + 1;
      piVar24 = piVar24 + 1;
    }
    else {
      piVar26 = piVar26 + 1;
      *piVar22 = iVar11;
      piVar22 = piVar22 + 1;
      local_68 = local_68 + 1;
      piVar21 = piVar19;
    }
  }
  for (lVar16 = 0; (int *)((long)piVar24 + lVar16) < piVar2; lVar16 = lVar16 + 4) {
    *(int *)((long)piVar19 + lVar16) = *(int *)((long)piVar24 + lVar16);
    piVar21 = piVar21 + 1;
  }
  for (lVar16 = 0; (int *)((long)piVar26 + lVar16) < piVar1; lVar16 = lVar16 + 4) {
    *(int *)((long)piVar22 + lVar16) = *(int *)((long)piVar26 + lVar16);
    local_68 = local_68 + 1;
  }
  Vec_IntShrink(pVVar14,(int)((ulong)((long)piVar21 - (long)pVVar14->pArray) >> 2));
  Vec_IntShrink(pVVar15,(int)((ulong)((long)local_68 - (long)pVVar15->pArray) >> 2));
  iVar25 = 1;
  iVar11 = 0;
  for (iVar20 = 0; iVar20 < (p->vCubesS).nSize; iVar20 = iVar20 + 1) {
    iVar9 = Vec_IntEntry(p_01,iVar20);
    pVVar14 = Vec_WecEntry(&p->vCubes,iVar9);
    bVar3 = false;
    bVar4 = false;
    for (iVar23 = 0; iVar23 < pVVar14->nSize; iVar23 = iVar23 + 1) {
      iVar10 = Vec_IntEntry(pVVar14,iVar23);
      bVar5 = bVar4;
      if (iVar10 == iVar8) {
        bVar5 = true;
      }
      if (iVar10 == iVar7) {
        bVar3 = true;
        bVar5 = bVar4;
      }
      bVar4 = bVar5;
    }
    if ((bVar3) && (bVar4)) {
      iVar9 = Pla_CubeHandle(iVar9,0xff);
      Vec_IntWriteEntry(p_01,iVar11,iVar9);
      iVar11 = iVar11 + 1;
    }
  }
  Vec_IntShrink(p_01,iVar11);
  pVVar15 = Vec_WecEntry(&p->vPairs,iDiv);
  pVVar14 = &p->vCubesD;
  iVar11 = Abc_LitNot(iVar7);
  iVar20 = Abc_LitNot(iVar8);
  (p->vCubesD).nSize = 0;
  for (iVar9 = 0; iVar9 + 1 < pVVar15->nSize; iVar9 = iVar9 + 2) {
    uVar6 = Vec_IntEntry(pVVar15,iVar9);
    uVar12 = Vec_IntEntry(pVVar15,iVar9 + 1);
    iVar23 = Fxch_TabCompare(p,uVar6,uVar12);
    if (iVar23 != 0) {
      pVVar17 = Fxch_ManCube(p,uVar6);
      iVar23 = Vec_IntEntry(pVVar17,uVar6 & 0xff);
      if (iVar23 == iVar11) {
        pVVar17 = Fxch_ManCube(p,uVar12);
        iVar23 = Vec_IntEntry(pVVar17,uVar12 & 0xff);
        if (iVar23 == iVar20) {
          Vec_IntPush(pVVar14,uVar6);
          Vec_IntPush(pVVar14,uVar12);
        }
      }
    }
  }
  pVVar15->nSize = 0;
  uVar6 = (p->vCubesD).nSize;
  if ((uVar6 & 1) == 0) {
    if (3 < (int)uVar6) {
      qsort((p->vCubesD).pArray,(ulong)(uVar6 >> 1),8,Vec_IntSortCompare1);
      for (lVar16 = 1; lVar16 < (p->vCubesD).nSize / 2; lVar16 = lVar16 + 1) {
        piVar2 = (p->vCubesD).pArray;
        iVar11 = piVar2[lVar16 * 2 + 1];
        if ((piVar2[lVar16 * 2] != piVar2[lVar16 * 2 + -2]) || (iVar11 != piVar2[lVar16 * 2 + -1]))
        {
          piVar2[iVar25 * 2] = piVar2[lVar16 * 2];
          piVar2[iVar25 * 2 + 1] = iVar11;
          iVar25 = iVar25 + 1;
        }
      }
      (p->vCubesD).nSize = iVar25 * 2;
    }
    for (iVar25 = 0; iVar25 < (p->vCubesS).nSize; iVar25 = iVar25 + 1) {
      iVar11 = Vec_IntEntry(p_01,iVar25);
      Fxch_TabSingleDivisors(p,iVar11 >> 8,0);
    }
    for (iVar25 = 1; iVar25 < (p->vCubesD).nSize; iVar25 = iVar25 + 2) {
      iVar11 = Vec_IntEntry(pVVar14,iVar25 + -1);
      iVar20 = Vec_IntEntry(pVVar14,iVar25);
      Fxch_TabSingleDivisors(p,iVar11 >> 8,0);
      Fxch_TabSingleDivisors(p,iVar20 >> 8,0);
    }
    for (iVar25 = 0; iVar25 < (p->vCubesS).nSize; iVar25 = iVar25 + 1) {
      iVar11 = Vec_IntEntry(p_01,iVar25);
      Fxch_TabDoubleDivisors(p,iVar11 >> 8,0);
    }
    for (iVar25 = 1; iVar25 < (p->vCubesD).nSize; iVar25 = iVar25 + 2) {
      iVar11 = Vec_IntEntry(pVVar14,iVar25 + -1);
      iVar20 = Vec_IntEntry(pVVar14,iVar25);
      Fxch_TabDoubleDivisors(p,iVar11 >> 8,0);
      Fxch_TabDoubleDivisors(p,iVar20 >> 8,0);
    }
    p->nLits = p->nLits + 2;
    iVar25 = (p->vLits).nSize / 2;
    Vec_WecPushLevel(p_00);
    pVVar15 = Vec_WecPushLevel(p_00);
    pVVar17 = Vec_WecEntry(p_00,(p->vLits).nSize + -2);
    for (iVar11 = 0; iVar11 < (p->vCubesS).nSize; iVar11 = iVar11 + 1) {
      iVar9 = Vec_IntEntry(p_01,iVar11);
      pVVar18 = Fxch_ManCube(p,iVar9);
      iVar20 = 0;
      for (iVar23 = 0; iVar23 < pVVar18->nSize; iVar23 = iVar23 + 1) {
        iVar10 = Vec_IntEntry(pVVar18,iVar23);
        if (iVar10 != iVar8 && iVar10 != iVar7) {
          Vec_IntWriteEntry(pVVar18,iVar20,iVar10);
          iVar20 = iVar20 + 1;
        }
      }
      if (pVVar18->nSize != iVar20 + 2) {
        __assert_fail("Vec_IntSize(p) == k + 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                      ,0x133,"void Fxch_CompressLiterals(Vec_Int_t *, int, int)");
      }
      Vec_IntShrink(pVVar18,iVar20);
      Vec_IntPush(pVVar17,iVar9 >> 8);
      iVar20 = Abc_Var2Lit(iVar25,0);
      Vec_IntPush(pVVar18,iVar20);
      p->nLits = p->nLits + -1;
    }
    uVar6 = 0;
    while( true ) {
      if ((p->vCubesD).nSize <= (int)(uVar6 | 1)) {
        Vec_IntSort(pVVar15,uVar6);
        Vec_IntSort(pVVar17,uVar6);
        for (iVar7 = 0; iVar7 < (p->vCubesS).nSize; iVar7 = iVar7 + 1) {
          iVar8 = Vec_IntEntry(p_01,iVar7);
          Fxch_TabSingleDivisors(p,iVar8 >> 8,1);
        }
        for (iVar7 = 1; iVar7 < (p->vCubesD).nSize; iVar7 = iVar7 + 2) {
          iVar8 = Vec_IntEntry(pVVar14,iVar7 + -1);
          Vec_IntEntry(pVVar14,iVar7);
          Fxch_TabSingleDivisors(p,iVar8 >> 8,1);
        }
        for (iVar7 = 0; iVar7 < (p->vCubesS).nSize; iVar7 = iVar7 + 1) {
          iVar8 = Vec_IntEntry(p_01,iVar7);
          Fxch_TabDoubleDivisors(p,iVar8 >> 8,1);
        }
        for (iVar7 = 1; iVar7 < (p->vCubesD).nSize; iVar7 = iVar7 + 2) {
          iVar8 = Vec_IntEntry(pVVar14,iVar7 + -1);
          Vec_IntEntry(pVVar14,iVar7);
          Fxch_TabDoubleDivisors(p,iVar8 >> 8,1);
        }
        return;
      }
      uVar12 = Vec_IntEntry(pVVar14,uVar6);
      uVar13 = Vec_IntEntry(pVVar14,uVar6 | 1);
      pVVar18 = Fxch_ManCube(p,uVar12);
      p_02 = Fxch_ManCube(p,uVar13);
      i = uVar12 & 0xff;
      iVar11 = Vec_IntEntry(pVVar18,i);
      iVar20 = Abc_LitNot(iVar7);
      if (iVar11 != iVar20) {
        __assert_fail("Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Abc_LitNot(Lit0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                      ,0x2c8,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
      }
      iVar11 = Vec_IntEntry(p_02,uVar13 & 0xff);
      iVar20 = Abc_LitNot(iVar8);
      if (iVar11 != iVar20) {
        __assert_fail("Vec_IntEntry(vCube2, Pla_CubeLit(hCube2)) == Abc_LitNot(Lit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                      ,0x2c9,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
      }
      iVar11 = pVVar18->nSize;
      if (iVar11 <= (int)i) break;
      iVar20 = 0;
      for (uVar13 = 0; (int)uVar13 < iVar11; uVar13 = uVar13 + 1) {
        iVar11 = Vec_IntEntry(pVVar18,uVar13);
        if (i != uVar13) {
          Vec_IntWriteEntry(pVVar18,iVar20,iVar11);
          iVar20 = iVar20 + 1;
        }
        iVar11 = pVVar18->nSize;
      }
      Vec_IntShrink(pVVar18,iVar20);
      Vec_IntPush(pVVar15,(int)uVar12 >> 8);
      iVar11 = Abc_Var2Lit(iVar25,1);
      Vec_IntPush(pVVar18,iVar11);
      p->nLits = p->nLits - p_02->nSize;
      p_02->nSize = 0;
      uVar6 = uVar6 + 2;
    }
    __assert_fail("iInd1 >= 0 && iInd1 < Vec_IntSize(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0x125,"void Fxch_CompressLiterals2(Vec_Int_t *, int, int)");
  }
  __assert_fail("Vec_IntSize(&p->vCubesD) % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                ,0x28a,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
}

Assistant:

void Fxch_ManUpdate( Fxch_Man_t * p, int iDiv )
{
    Vec_Int_t * vCube1, * vCube2, * vLitP, * vLitN;
    //int nLitsNew = p->nLits - (int)Vec_FltEntry(&p->vWeights, iDiv);
    int i, Lit0, Lit1, hCube1, hCube2, iVarNew;
    //float Diff = Vec_FltEntry(&p->vWeights, iDiv) - (float)((int)Vec_FltEntry(&p->vWeights, iDiv));
    //assert( Diff > 0.0 && Diff < 1.0 );

    // get the divisor and select pivot variables
    Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF ); 
    Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF );
    Lit0 = Hash_IntObjData0( p->vHash, iDiv );
    Lit1 = Hash_IntObjData1( p->vHash, iDiv );
    assert( Lit0 >= 0 && Lit1 >= 0 && Lit0 < Lit1 );
    Vec_WrdPush( &p->vDivs, ((word)Lit1 << 32) | (word)Lit0 );

    // if the input cover is not prime, it may happen that we are extracting divisor (x + !x)
    // although it is not strictly correct, it seems to be fine to just skip such divisors
//    if ( Abc_Lit2Var(Lit0) == Abc_Lit2Var(Lit1) && Vec_IntSize(Hsh_VecReadEntry(p->vHash, iDiv)) == 2 )
//        return;

    // collect single-cube-divisor cubes
    vLitP = Vec_WecEntry(&p->vLits, Lit0);
    vLitN = Vec_WecEntry(&p->vLits, Lit1);
    Fxch_CompressCubes( p, vLitP );
    Fxch_CompressCubes( p, vLitN );
//    Fxch_CollectSingles( vLitP, vLitN, &p->vCubesS );
//    assert( Vec_IntSize(&p->vCubesS) % 2 == 0 );
    Vec_IntTwoRemoveCommon( vLitP, vLitN, &p->vCubesS );
    Fxch_FilterCubes( p, &p->vCubesS, Lit0, Lit1 );

    // collect double-cube-divisor cube pairs
    Fxch_CollectDoubles( p, Vec_WecEntry(&p->vPairs, iDiv), &p->vCubesD, Abc_LitNot(Lit0), Abc_LitNot(Lit1) );
    assert( Vec_IntSize(&p->vCubesD) % 2 == 0 );
    Vec_IntUniqifyPairs( &p->vCubesD );
    assert( Vec_IntSize(&p->vCubesD) % 2 == 0 );

    // subtract cost of single-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 0 );  // remove - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 0 ),  // remove - update
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube2), 0 );  // remove - update

    // subtract cost of double-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
    {
        //printf( "%d ", Pla_CubeNum(hCube1) );
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 0 );  // remove - update
    }
    //printf( "\n" );

    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
    {
        //printf( "%d ", Pla_CubeNum(hCube1) );
        //printf( "%d  ", Pla_CubeNum(hCube2) );
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 0 ),  // remove - update
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube2), 0 );  // remove - update
    }
    //printf( "\n" );

    // create new literals
    p->nLits += 2;
    iVarNew = Vec_WecSize( &p->vLits ) / 2;
    vLitP = Vec_WecPushLevel( &p->vLits );
    vLitN = Vec_WecPushLevel( &p->vLits );
    vLitP = Vec_WecEntry( &p->vLits, Vec_WecSize(&p->vLits) - 2 );
    // update single-cube divisor cubes
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
    {
//        int Lit0s, Lit1s;
        vCube1 = Fxch_ManCube( p, hCube1 );
//        Lit0s = Vec_IntEntry(vCube1, Pla_CubeLit(hCube1));
//        Lit1s = Vec_IntEntry(vCube1, Pla_CubeLit(hCube2));
//        assert( Pla_CubeNum(hCube1) == Pla_CubeNum(hCube2) );
//        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Lit0 );
//        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube2)) == Lit1 );
        Fxch_CompressLiterals( vCube1, Lit0, Lit1 );
//        Vec_IntPush( vLitP, Pla_CubeHandle(Pla_CubeNum(hCube1), Vec_IntSize(vCube1)) );
        Vec_IntPush( vLitP, Pla_CubeNum(hCube1) );
        Vec_IntPush( vCube1, Abc_Var2Lit(iVarNew, 0) );

        //if ( Pla_CubeNum(hCube1) == 3 )
        //    printf( "VecSize = %d\n", Vec_IntSize(vCube1) );

        p->nLits--;
    }
    // update double-cube divisor cube pairs
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
    {
        vCube1 = Fxch_ManCube( p, hCube1 );
        vCube2 = Fxch_ManCube( p, hCube2 );
        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Abc_LitNot(Lit0) );
        assert( Vec_IntEntry(vCube2, Pla_CubeLit(hCube2)) == Abc_LitNot(Lit1) );
        Fxch_CompressLiterals2( vCube1, Pla_CubeLit(hCube1), -1 );
//        Vec_IntPush( vLitN, Pla_CubeHandle(Pla_CubeNum(hCube1), Vec_IntSize(vCube1)) );
        Vec_IntPush( vLitN, Pla_CubeNum(hCube1) );
        Vec_IntPush( vCube1, Abc_Var2Lit(iVarNew, 1) );
        p->nLits -= Vec_IntSize(vCube2);

        //if ( Pla_CubeNum(hCube1) == 3 )
        //    printf( "VecSize = %d\n", Vec_IntSize(vCube1) );

        // remove second cube
        Vec_IntClear( vCube2 ); 
    }
    Vec_IntSort( vLitN, 0 );
    Vec_IntSort( vLitP, 0 );

    // add cost of single-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update

    // add cost of double-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    
    // check predicted improvement: (new SOP lits == old SOP lits - divisor weight)
    //assert( p->nLits == nLitsNew );
}